

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_10.hpp
# Opt level: O0

type * boost::phoenix::
       expr_ext<boost::phoenix::actor,_boost::phoenix::detail::tag::function_eval,_boost::phoenix::stl::size,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
       ::make(type *__return_storage_ptr__,param_type a0,param_type a1)

{
  param_type a1_local;
  param_type a0_local;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>
  e;
  expr_type that;
  
  return *(type **)a0;
}

Assistant:

static type make(typename call_traits<A0>::param_type a0 , typename call_traits<A1>::param_type a1)
      { 
        
                actor<base_type> const e =
                {
                    proto::make_expr<
                        Tag
                      , phoenix_default_domain 
                    >(a0 , a1)
                };
            return e;
        }